

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32ppcbe.c
# Opt level: O0

void make_ddrelocs(GlobalVars *gv,LinkedSection *ddrel)

{
  long lVar1;
  LinkedSection *pLVar2;
  size_t size_00;
  void *vp;
  char *in_RSI;
  GlobalVars *in_RDI;
  uint32_t nrelocs;
  unsigned_long size;
  uint32_t *p;
  uint8_t *table;
  Reloc *rel;
  Section *sec;
  LinkedSection *sdata;
  uint32_t local_44;
  void *local_38;
  node *local_28;
  undefined8 in_stack_ffffffffffffffe8;
  
  local_44 = 0;
  pLVar2 = find_lnksec(in_RDI,in_RSI,(uint8_t)((ulong)in_stack_ffffffffffffffe8 >> 0x38),
                       (uint8_t)((ulong)in_stack_ffffffffffffffe8 >> 0x30),
                       (uint8_t)((ulong)in_stack_ffffffffffffffe8 >> 0x28),
                       (uint8_t)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  if (pLVar2 != (LinkedSection *)0x0) {
    for (local_28 = (pLVar2->relocs).first; local_28->next != (node *)0x0; local_28 = local_28->next
        ) {
      if (((LinkedSection *)local_28[1].pred == pLVar2) && (*(char *)&local_28[3].pred == '\x01')) {
        local_44 = local_44 + 1;
      }
    }
  }
  size_00 = (ulong)(local_44 + 1) << 2;
  vp = alloc(size_00);
  local_38 = (void *)((long)vp + 4);
  write32be(vp,local_44);
  if (pLVar2 != (LinkedSection *)0x0) {
    for (local_28 = (pLVar2->relocs).first; local_28->next != (node *)0x0; local_28 = local_28->next
        ) {
      if (((LinkedSection *)local_28[1].pred == pLVar2) && (*(char *)&local_28[3].pred == '\x01')) {
        write32be(local_38,(uint32_t)local_28[2].next);
        local_38 = (void *)((long)local_38 + 4);
      }
    }
  }
  *(void **)(in_RSI + 0x80) = vp;
  *(size_t *)(in_RSI + 0x58) = size_00;
  *(size_t *)(in_RSI + 0x50) = size_00;
  lVar1 = *(long *)(in_RSI + 0x68);
  if (lVar1 != 0) {
    *(void **)(lVar1 + 0x48) = vp;
    *(size_t *)(lVar1 + 0x50) = size_00;
  }
  return;
}

Assistant:

static void make_ddrelocs(struct GlobalVars *gv,struct LinkedSection *ddrel)
{
  struct LinkedSection *sdata;
  struct Section *sec;
  struct Reloc *rel;
  uint8_t *table;
  uint32_t *p;
  unsigned long size;
  uint32_t nrelocs = 0;

  if (sdata = find_lnksec(gv,sdata_name,0,0,0,0)) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        nrelocs++;
    }
  }

  size = (nrelocs+1) * sizeof(uint32_t);
  table = alloc(size);
  p = (uint32_t *)table;
  write32be(p++,nrelocs);

  if (sdata) {
    for (rel=(struct Reloc *)sdata->relocs.first;
         rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
      if (rel->relocsect.lnk==sdata && rel->rtype==R_ABS)
        write32be(p++,(uint32_t)rel->offset);
    }
  }

  ddrel->data = table;
  ddrel->size = ddrel->filesize = size;
  if (sec = (struct Section *)ddrel->sections.first) {
    sec->data = table;
    sec->size = size;
  }
}